

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int pcie_cfg_write_dw(nettlp_pcie_cfg *ntpc,uint16_t dwaddr,uint8_t mask,uint32_t data)

{
  ssize_t sVar1;
  __uint32_t in_ECX;
  byte in_DL;
  uint16_t in_SI;
  long in_RDI;
  nettlp_pcie_cfg_pkt pkt;
  int ret;
  nettlp_pcie_cfg_pkt local_22;
  __uint32_t local_18;
  long local_10;
  int local_4;
  
  local_22._0_1_ = local_22._0_1_ & 3 | 0x40 | (in_DL & 0xf) << 2;
  local_18 = in_ECX;
  local_10 = in_RDI;
  pcie_cfg_set_dwaddr(&local_22,in_SI);
  local_22.data = __bswap_32(local_18);
  sVar1 = write(*(int *)(local_10 + 8),&local_22,6);
  local_4 = (int)sVar1;
  if (-1 < local_4) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int pcie_cfg_write_dw(struct nettlp_pcie_cfg *ntpc, uint16_t dwaddr,
			     uint8_t mask, uint32_t data)
{
	int ret;
	struct nettlp_pcie_cfg_pkt pkt;

	pkt.cmd = NETTLP_PCIE_CFG_CMD_WRITE;
	pkt.mask = mask;
	pcie_cfg_set_dwaddr(&pkt, dwaddr);
	pkt.data = htobe32(data);
	ret = write(ntpc->sockfd, &pkt, sizeof(pkt));
	if (ret < 0)
		return ret;

	return 0;
}